

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O0

void __thiscall xLearn::Model::initial(Model *this,bool set_val)

{
  int iVar1;
  void *pvVar2;
  ostream *poVar3;
  byte in_SIL;
  char *in_RDI;
  bad_alloc *anon_var_0;
  int ret;
  Logger *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffef8;
  Model *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  allocator *paVar4;
  allocator local_71;
  string local_70 [39];
  allocator local_49;
  string local_48 [52];
  Logger local_14;
  int local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  pvVar2 = malloc((ulong)*(uint *)(in_RDI + 0x40) << 2);
  *(void **)(in_RDI + 0x58) = pvVar2;
  pvVar2 = malloc((ulong)*(uint *)(in_RDI + 0x54) << 2);
  *(void **)(in_RDI + 0x68) = pvVar2;
  iVar1 = std::__cxx11::string::compare(in_RDI);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare(in_RDI);
    if (iVar1 != 0) {
      in_RDI[0x60] = '\0';
      in_RDI[0x61] = '\0';
      in_RDI[0x62] = '\0';
      in_RDI[99] = '\0';
      in_RDI[100] = '\0';
      in_RDI[0x65] = '\0';
      in_RDI[0x66] = '\0';
      in_RDI[0x67] = '\0';
      goto LAB_00143013;
    }
  }
  local_10 = posix_memalign((void **)(in_RDI + 0x60),0x10,(ulong)*(uint *)(in_RDI + 0x44) << 2);
  if (local_10 != 0) {
    Logger::Logger(&local_14,ERR);
    iVar1 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters.cc"
               ,&local_49);
    paVar4 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"initial",paVar4);
    poVar3 = Logger::Start((LogSeverity)((ulong)paVar4 >> 0x20),in_stack_ffffffffffffff08,iVar1,
                           in_stack_fffffffffffffef8);
    poVar3 = std::operator<<(poVar3,"CHECK_EQ failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters.cc"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,99);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"ret");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_10);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"0");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    Logger::~Logger(in_stack_fffffffffffffe90);
    abort();
  }
  local_10 = 0;
LAB_00143013:
  if ((local_9 & 1) != 0) {
    set_value(in_stack_ffffffffffffff00);
  }
  return;
}

Assistant:

void Model::initial(bool set_val) {
  try {
    // Conventional malloc for linear term and bias
    param_w_ = (real_t*)malloc(param_num_w_ * sizeof(real_t));
    param_b_ = (real_t*)malloc(aux_size_ * sizeof(real_t));
    if (score_func_.compare("fm") == 0 ||
        score_func_.compare("ffm") == 0) {
      // Aligned malloc for latent factor
#ifdef _MSC_VER
      param_v_ = (decltype(param_v_))_aligned_malloc(
                 param_num_v_ * sizeof(real_t),
                 kAlignByte);
#else
      int ret = posix_memalign(
                (void**)&param_v_,
                kAlignByte,
                param_num_v_ * sizeof(real_t));
      CHECK_EQ(ret, 0);
#endif
    } else {
      param_v_ = nullptr;
    }
  } catch (std::bad_alloc&) {
    LOG(FATAL) << "Cannot allocate enough memory for current  \
                   model parameters. Parameter size: "
               << GetNumParameter();
  }
  // Set value for model
  if (set_val) {
    set_value();
  }
}